

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcore_unix.cpp
# Opt level: O2

QByteArray * qt_readlink(QByteArray *__return_storage_ptr__,char *path)

{
  Data *pDVar1;
  qsizetype qVar2;
  char *pcVar3;
  undefined1 *size;
  int *piVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray((QByteArray *)&local_38,0x100,Uninitialized);
  do {
    pcVar3 = QByteArray::data((QByteArray *)&local_38);
    size = (undefined1 *)readlink(path,pcVar3,local_38.size);
    if (size != (undefined1 *)local_38.size) {
      if (size == (undefined1 *)0xffffffffffffffff) {
LAB_00160541:
        (__return_storage_ptr__->d).d = (Data *)0x0;
        (__return_storage_ptr__->d).ptr = (char *)0x0;
        (__return_storage_ptr__->d).size = 0;
      }
      else {
        QByteArray::resize((QByteArray *)&local_38,(qsizetype)size);
        qVar2 = local_38.size;
        pcVar3 = local_38.ptr;
        pDVar1 = local_38.d;
        local_38.d = (Data *)0x0;
        local_38.ptr = (char *)0x0;
        (__return_storage_ptr__->d).d = pDVar1;
        (__return_storage_ptr__->d).ptr = pcVar3;
        local_38.size = 0;
        (__return_storage_ptr__->d).size = qVar2;
      }
      QArrayDataPointer<char>::~QArrayDataPointer(&local_38);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        return __return_storage_ptr__;
      }
      __stack_chk_fail();
    }
    if ((undefined1 *)0xfff < size) {
      piVar4 = __errno_location();
      *piVar4 = 0x24;
      goto LAB_00160541;
    }
    QByteArray::resize((QByteArray *)&local_38,(long)size * 2);
  } while( true );
}

Assistant:

QByteArray qt_readlink(const char *path)
{
#ifndef PATH_MAX
    // suitably large value that won't consume too much memory
#  define PATH_MAX  1024*1024
#endif

    QByteArray buf(256, Qt::Uninitialized);

    ssize_t len = ::readlink(path, buf.data(), buf.size());
    while (len == buf.size()) {
        // readlink(2) will fill our buffer and not necessarily terminate with NUL;
        if (buf.size() >= PATH_MAX) {
            errno = ENAMETOOLONG;
            return QByteArray();
        }

        // double the size and try again
        buf.resize(buf.size() * 2);
        len = ::readlink(path, buf.data(), buf.size());
    }

    if (len == -1)
        return QByteArray();

    buf.resize(len);
    return buf;
}